

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_encode_utils.c
# Opt level: O0

void GenerateOptimalTree(uint32_t *histogram,int histogram_size,HuffmanTree *tree,
                        int tree_depth_limit,uint8_t *bit_depths)

{
  undefined8 *puVar1;
  int in_ECX;
  undefined8 *puVar2;
  int iVar3;
  void *in_RDX;
  int in_ESI;
  long in_RDI;
  byte *in_R8;
  int max_depth;
  int k;
  uint32_t count_1;
  int tree_pool_size;
  uint32_t count;
  int j;
  int idx;
  int tree_size;
  int i;
  int tree_size_orig;
  HuffmanTree *tree_pool;
  uint32_t count_min;
  uint in_stack_ffffffffffffff9c;
  uint in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  uint in_stack_ffffffffffffffa8;
  int iVar4;
  uint in_stack_ffffffffffffffb0;
  int iVar5;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  uint local_2c;
  
  local_3c = 0;
  for (local_40 = 0; local_40 < in_ESI; local_40 = local_40 + 1) {
    if (*(int *)(in_RDI + (long)local_40 * 4) != 0) {
      local_3c = local_3c + 1;
    }
  }
  if (local_3c != 0) {
    local_2c = 1;
    while( true ) {
      local_44 = local_3c;
      local_48 = 0;
      for (iVar5 = 0; iVar5 < in_ESI; iVar5 = iVar5 + 1) {
        if (*(int *)(in_RDI + (long)iVar5 * 4) != 0) {
          in_stack_ffffffffffffff9c = local_2c;
          if (local_2c <= *(uint *)(in_RDI + (long)iVar5 * 4)) {
            in_stack_ffffffffffffff9c = *(uint *)(in_RDI + (long)iVar5 * 4);
          }
          *(uint *)((long)in_RDX + (long)local_48 * 0x10) = in_stack_ffffffffffffff9c;
          *(int *)((long)in_RDX + (long)local_48 * 0x10 + 4) = iVar5;
          *(undefined4 *)((long)in_RDX + (long)local_48 * 0x10 + 8) = 0xffffffff;
          *(undefined4 *)((long)in_RDX + (long)local_48 * 0x10 + 0xc) = 0xffffffff;
          local_48 = local_48 + 1;
          in_stack_ffffffffffffffb0 = in_stack_ffffffffffffff9c;
        }
      }
      qsort(in_RDX,(long)local_3c,0x10,CompareHuffmanTrees);
      if (local_3c < 2) {
        if (local_3c == 1) {
          in_R8[*(int *)((long)in_RDX + 4)] = 1;
        }
      }
      else {
        iVar4 = 0;
        for (; 1 < local_44; local_44 = local_44 + -1) {
          puVar1 = (undefined8 *)((long)in_RDX + (long)iVar4 * 0x10 + (long)local_3c * 0x10);
          puVar2 = (undefined8 *)((long)in_RDX + (long)(local_44 + -1) * 0x10);
          *puVar1 = *puVar2;
          puVar1[1] = puVar2[1];
          iVar3 = iVar4 + 2;
          puVar1 = (undefined8 *)((long)in_RDX + (long)(iVar4 + 1) * 0x10 + (long)local_3c * 0x10);
          puVar2 = (undefined8 *)((long)in_RDX + (long)(local_44 + -2) * 0x10);
          *puVar1 = *puVar2;
          puVar1[1] = puVar2[1];
          in_stack_ffffffffffffffa8 =
               *(int *)((long)in_RDX + (long)(iVar4 + 1) * 0x10 + (long)local_3c * 0x10) +
               *(int *)((long)in_RDX + (long)iVar4 * 0x10 + (long)local_3c * 0x10);
          in_stack_ffffffffffffffa4 = 0;
          while ((in_stack_ffffffffffffffa4 < local_44 + -2 &&
                 (in_stack_ffffffffffffffa8 <
                  *(uint *)((long)in_RDX + (long)in_stack_ffffffffffffffa4 * 0x10)))) {
            in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa4 + 1;
          }
          memmove((void *)((long)in_RDX + (long)(in_stack_ffffffffffffffa4 + 1) * 0x10),
                  (void *)((long)in_RDX + (long)in_stack_ffffffffffffffa4 * 0x10),
                  (long)((local_44 + -2) - in_stack_ffffffffffffffa4) << 4);
          *(uint *)((long)in_RDX + (long)in_stack_ffffffffffffffa4 * 0x10) =
               in_stack_ffffffffffffffa8;
          *(undefined4 *)((long)in_RDX + (long)in_stack_ffffffffffffffa4 * 0x10 + 4) = 0xffffffff;
          *(int *)((long)in_RDX + (long)in_stack_ffffffffffffffa4 * 0x10 + 8) = iVar3 + -1;
          *(int *)((long)in_RDX + (long)in_stack_ffffffffffffffa4 * 0x10 + 0xc) = iVar3 + -2;
          iVar4 = iVar3;
        }
        SetBitDepths((HuffmanTree *)CONCAT44(iVar5,in_stack_ffffffffffffffb0),
                     (HuffmanTree *)CONCAT44(iVar4,in_stack_ffffffffffffffa8),
                     (uint8_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff9c);
      }
      in_stack_ffffffffffffffa0 = (uint)*in_R8;
      for (iVar5 = 1; iVar5 < in_ESI; iVar5 = iVar5 + 1) {
        if (in_stack_ffffffffffffffa0 < in_R8[iVar5]) {
          in_stack_ffffffffffffffa0 = (uint)in_R8[iVar5];
        }
      }
      if ((int)in_stack_ffffffffffffffa0 <= in_ECX) break;
      local_2c = local_2c << 1;
    }
  }
  return;
}

Assistant:

static void GenerateOptimalTree(const uint32_t* const histogram,
                                int histogram_size,
                                HuffmanTree* tree, int tree_depth_limit,
                                uint8_t* const bit_depths) {
  uint32_t count_min;
  HuffmanTree* tree_pool;
  int tree_size_orig = 0;
  int i;

  for (i = 0; i < histogram_size; ++i) {
    if (histogram[i] != 0) {
      ++tree_size_orig;
    }
  }

  if (tree_size_orig == 0) {   // pretty optimal already!
    return;
  }

  tree_pool = tree + tree_size_orig;

  // For block sizes with less than 64k symbols we never need to do a
  // second iteration of this loop.
  // If we actually start running inside this loop a lot, we would perhaps
  // be better off with the Katajainen algorithm.
  assert(tree_size_orig <= (1 << (tree_depth_limit - 1)));
  for (count_min = 1; ; count_min *= 2) {
    int tree_size = tree_size_orig;
    // We need to pack the Huffman tree in tree_depth_limit bits.
    // So, we try by faking histogram entries to be at least 'count_min'.
    int idx = 0;
    int j;
    for (j = 0; j < histogram_size; ++j) {
      if (histogram[j] != 0) {
        const uint32_t count =
            (histogram[j] < count_min) ? count_min : histogram[j];
        tree[idx].total_count_ = count;
        tree[idx].value_ = j;
        tree[idx].pool_index_left_ = -1;
        tree[idx].pool_index_right_ = -1;
        ++idx;
      }
    }

    // Build the Huffman tree.
    qsort(tree, tree_size, sizeof(*tree), CompareHuffmanTrees);

    if (tree_size > 1) {  // Normal case.
      int tree_pool_size = 0;
      while (tree_size > 1) {  // Finish when we have only one root.
        uint32_t count;
        tree_pool[tree_pool_size++] = tree[tree_size - 1];
        tree_pool[tree_pool_size++] = tree[tree_size - 2];
        count = tree_pool[tree_pool_size - 1].total_count_ +
                tree_pool[tree_pool_size - 2].total_count_;
        tree_size -= 2;
        {
          // Search for the insertion point.
          int k;
          for (k = 0; k < tree_size; ++k) {
            if (tree[k].total_count_ <= count) {
              break;
            }
          }
          memmove(tree + (k + 1), tree + k, (tree_size - k) * sizeof(*tree));
          tree[k].total_count_ = count;
          tree[k].value_ = -1;

          tree[k].pool_index_left_ = tree_pool_size - 1;
          tree[k].pool_index_right_ = tree_pool_size - 2;
          tree_size = tree_size + 1;
        }
      }
      SetBitDepths(&tree[0], tree_pool, bit_depths, 0);
    } else if (tree_size == 1) {  // Trivial case: only one element.
      bit_depths[tree[0].value_] = 1;
    }

    {
      // Test if this Huffman tree satisfies our 'tree_depth_limit' criteria.
      int max_depth = bit_depths[0];
      for (j = 1; j < histogram_size; ++j) {
        if (max_depth < bit_depths[j]) {
          max_depth = bit_depths[j];
        }
      }
      if (max_depth <= tree_depth_limit) {
        break;
      }
    }
  }
}